

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void test_ranges_impl<trng::mrg3s,long_double>(void)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  ExprLhs<bool> EVar1;
  ExprLhs<bool> EVar2;
  ExprLhs<bool> EVar3;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  longdouble x_max;
  longdouble x_min;
  generator_max<trng::mrg3s> r_max;
  generator_min<trng::mrg3s> r_min;
  undefined4 in_stack_fffffffffffffd88;
  Flags in_stack_fffffffffffffd8c;
  AssertionHandler *in_stack_fffffffffffffd90;
  AssertionHandler *this;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  AssertionHandler *in_stack_fffffffffffffda0;
  AssertionHandler *this_00;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffdaf;
  generator_max<trng::mrg3s> *in_stack_fffffffffffffdb0;
  SourceLineInfo *this_01;
  undefined6 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 uVar5;
  AssertionHandler *this_02;
  AssertionHandler local_220;
  undefined1 local_1b1;
  AssertionHandler local_1a0;
  undefined1 local_131;
  SourceLineInfo local_120;
  StringRef local_110;
  undefined1 local_a1;
  AssertionHandler local_90;
  longdouble local_28;
  longdouble local_18;
  
  local_28 = (longdouble)0;
  local_18 = local_28;
  trng::utility::u01xx_traits<long_double,_1UL,_generator_min<trng::mrg3s>_>::cc
            ((generator_min<trng::mrg3s> *)in_stack_fffffffffffffdb0);
  trng::utility::u01xx_traits<long_double,_1UL,_generator_max<trng::mrg3s>_>::cc
            (in_stack_fffffffffffffdb0);
  local_90.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffd90,
                  CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  this_02 = &local_90;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x88);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffda0,
             (char *)CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
  capturedExpression.m_start._6_1_ = in_stack_fffffffffffffdae;
  capturedExpression.m_start._0_6_ = in_stack_fffffffffffffda8;
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffdaf;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffdb0;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffda0,
             (StringRef *)
             CONCAT17(in_stack_fffffffffffffd9f,
                      CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)),
             (SourceLineInfo *)in_stack_fffffffffffffd90,capturedExpression,
             in_stack_fffffffffffffd8c);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     false);
  local_a1 = EVar1;
  Catch::AssertionHandler::handleExpr<bool>
            (this_02,(ExprLhs<bool> *)
                     CONCAT17(EVar1.m_lhs,
                              CONCAT16(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdb8)));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd90);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd90);
  trng::utility::u01xx_traits<long_double,_1UL,_generator_min<trng::mrg3s>_>::co
            ((generator_min<trng::mrg3s> *)in_stack_fffffffffffffd90);
  local_18 = in_ST2;
  trng::utility::u01xx_traits<long_double,_1UL,_generator_max<trng::mrg3s>_>::co
            ((generator_max<trng::mrg3s> *)in_stack_fffffffffffffd90);
  local_28 = in_ST3;
  local_110 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd90,
                         CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  this_01 = &local_120;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x8b);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffda0,
             (char *)CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
  capturedExpression_00.m_start._6_1_ = in_stack_fffffffffffffdae;
  capturedExpression_00.m_start._0_6_ = in_stack_fffffffffffffda8;
  capturedExpression_00.m_start._7_1_ = in_stack_fffffffffffffdaf;
  capturedExpression_00.m_size = (size_type)this_01;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffda0,
             (StringRef *)
             CONCAT17(in_stack_fffffffffffffd9f,
                      CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)),
             (SourceLineInfo *)in_stack_fffffffffffffd90,capturedExpression_00,
             in_stack_fffffffffffffd8c);
  uVar5 = (longdouble)0 <= local_18 && local_28 < (longdouble)1;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     false);
  local_131 = EVar2;
  Catch::AssertionHandler::handleExpr<bool>
            (this_02,(ExprLhs<bool> *)
                     CONCAT17(EVar1.m_lhs,CONCAT16(uVar5,in_stack_fffffffffffffdb8)));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd90);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd90);
  trng::utility::u01xx_traits<long_double,_1UL,_generator_min<trng::mrg3s>_>::oc
            ((generator_min<trng::mrg3s> *)0x2a0f8d);
  local_18 = in_ST4;
  trng::utility::u01xx_traits<long_double,_1UL,_generator_max<trng::mrg3s>_>::oc
            ((generator_max<trng::mrg3s> *)0x2a0fa1);
  local_28 = in_ST5;
  local_1a0.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffd90,
                  CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  this_00 = &local_1a0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x8e);
  Catch::StringRef::StringRef
            ((StringRef *)this_00,
             (char *)CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
  capturedExpression_01.m_start._6_1_ = in_stack_fffffffffffffdae;
  capturedExpression_01.m_start._0_6_ = in_stack_fffffffffffffda8;
  capturedExpression_01.m_start._7_1_ = EVar2.m_lhs;
  capturedExpression_01.m_size = (size_type)this_01;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)),
             (SourceLineInfo *)in_stack_fffffffffffffd90,capturedExpression_01,
             in_stack_fffffffffffffd8c);
  uVar4 = (longdouble)0 < local_18 && local_28 <= (longdouble)1;
  EVar3 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     false);
  local_1b1 = EVar3;
  Catch::AssertionHandler::handleExpr<bool>
            (this_02,(ExprLhs<bool> *)
                     CONCAT17(EVar1.m_lhs,CONCAT16(uVar5,in_stack_fffffffffffffdb8)));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd90);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd90);
  trng::utility::u01xx_traits<long_double,_1UL,_generator_min<trng::mrg3s>_>::oo
            ((generator_min<trng::mrg3s> *)this_00);
  trng::utility::u01xx_traits<long_double,_1UL,_generator_max<trng::mrg3s>_>::oo
            ((generator_max<trng::mrg3s> *)this_00);
  local_220.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffd90,
                  CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  this = &local_220;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_engines.cc"
             ,0x91);
  Catch::StringRef::StringRef
            ((StringRef *)this_00,
             (char *)CONCAT17(EVar3.m_lhs,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
  capturedExpression_02.m_start._6_1_ = uVar4;
  capturedExpression_02.m_start._0_6_ = in_stack_fffffffffffffda8;
  capturedExpression_02.m_start._7_1_ = EVar2.m_lhs;
  capturedExpression_02.m_size = (size_type)this_01;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)
                     CONCAT17(EVar3.m_lhs,
                              CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)),
             (SourceLineInfo *)this,capturedExpression_02,in_stack_fffffffffffffd8c);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),false);
  Catch::AssertionHandler::handleExpr<bool>
            (this_02,(ExprLhs<bool> *)
                     CONCAT17(EVar1.m_lhs,CONCAT16(uVar5,in_stack_fffffffffffffdb8)));
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  return;
}

Assistant:

void test_ranges_impl() {
  generator_min<R> r_min;
  generator_max<R> r_max;
  using u01xx_min = trng::utility::u01xx_traits<T, 1, generator_min<R>>;
  using u01xx_max = trng::utility::u01xx_traits<T, 1, generator_max<R>>;
  T x_min{}, x_max{};
  x_min = u01xx_min::cc(r_min);
  x_max = u01xx_max::cc(r_max);
  REQUIRE((x_min >= 0 and x_max <= 1));
  x_min = u01xx_min::co(r_min);
  x_max = u01xx_max::co(r_max);
  REQUIRE((x_min >= 0 and x_max < 1));
  x_min = u01xx_min::oc(r_min);
  x_max = u01xx_max::oc(r_max);
  REQUIRE((x_min > 0 and x_max <= 1));
  x_min = u01xx_min::oo(r_min);
  x_max = u01xx_max::oo(r_max);
  REQUIRE((x_min > 0 and x_max < 1));
}